

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlStrsub(void)

{
  int iVar1;
  int iVar2;
  xmlChar *val;
  xmlChar *val_00;
  int local_34;
  int local_30;
  int n_len;
  int len;
  int n_start;
  int start;
  int n_str;
  xmlChar *str;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (n_start = 0; n_start < 5; n_start = n_start + 1) {
    for (n_len = 0; n_len < 4; n_len = n_len + 1) {
      for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
        iVar1 = xmlMemBlocks();
        val = gen_const_xmlChar_ptr(n_start,0);
        len = gen_int(n_len,1);
        local_30 = gen_int(local_34,2);
        if (val != (xmlChar *)0x0) {
          iVar2 = xmlStrlen(val);
          if (iVar2 < len) {
            len = 0;
          }
        }
        if (val != (xmlChar *)0x0) {
          iVar2 = xmlStrlen(val);
          if (iVar2 < local_30) {
            local_30 = 0;
          }
        }
        val_00 = (xmlChar *)xmlStrsub(val,len,local_30);
        desret_xmlChar_ptr(val_00);
        call_tests = call_tests + 1;
        des_const_xmlChar_ptr(n_start,val,0);
        des_int(n_len,len,1);
        des_int(local_34,local_30,2);
        xmlResetLastError();
        iVar2 = xmlMemBlocks();
        if (iVar1 != iVar2) {
          iVar2 = xmlMemBlocks();
          printf("Leak of %d blocks found in xmlStrsub",(ulong)(uint)(iVar2 - iVar1));
          ret_val._4_4_ = ret_val._4_4_ + 1;
          printf(" %d",(ulong)(uint)n_start);
          printf(" %d",(ulong)(uint)n_len);
          printf(" %d");
          printf("\n");
        }
      }
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlStrsub(void) {
    int test_ret = 0;

    int mem_base;
    xmlChar * ret_val;
    const xmlChar * str; /* the xmlChar * array (haystack) */
    int n_str;
    int start; /* the index of the first char (zero based) */
    int n_start;
    int len; /* the length of the substring */
    int n_len;

    for (n_str = 0;n_str < gen_nb_const_xmlChar_ptr;n_str++) {
    for (n_start = 0;n_start < gen_nb_int;n_start++) {
    for (n_len = 0;n_len < gen_nb_int;n_len++) {
        mem_base = xmlMemBlocks();
        str = gen_const_xmlChar_ptr(n_str, 0);
        start = gen_int(n_start, 1);
        len = gen_int(n_len, 2);
        if ((str != NULL) &&
            (start > xmlStrlen(BAD_CAST str)))
            start = 0;
        if ((str != NULL) &&
            (len > xmlStrlen(BAD_CAST str)))
            len = 0;

        ret_val = xmlStrsub(str, start, len);
        desret_xmlChar_ptr(ret_val);
        call_tests++;
        des_const_xmlChar_ptr(n_str, str, 0);
        des_int(n_start, start, 1);
        des_int(n_len, len, 2);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlStrsub",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_str);
            printf(" %d", n_start);
            printf(" %d", n_len);
            printf("\n");
        }
    }
    }
    }
    function_tests++;

    return(test_ret);
}